

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper_functions.h
# Opt level: O0

bool read_control_data(string *filename,vector<control_s,_std::allocator<control_s>_> *position_meas
                      )

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  istream *piVar4;
  undefined1 local_3f8 [8];
  control_s meas;
  double yawrate;
  double velocity;
  istringstream iss_pos;
  string local_258 [8];
  string line_pos;
  long local_228;
  ifstream in_file_pos;
  vector<control_s,_std::allocator<control_s>_> *position_meas_local;
  string *filename_local;
  
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(&local_228,pcVar3,_S_in);
  bVar1 = std::ios::operator!((ios *)((long)&local_228 + *(long *)(local_228 + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::__cxx11::string::string(local_258);
    while( true ) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&local_228,local_258);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
      if (!bVar2) break;
      std::__cxx11::istringstream::istringstream((istringstream *)&velocity,local_258,_S_in);
      std::istream::operator>>((istream *)&velocity,&yawrate);
      std::istream::operator>>((istream *)&velocity,&meas.yawrate);
      local_3f8 = (undefined1  [8])yawrate;
      meas.velocity = meas.yawrate;
      std::vector<control_s,_std::allocator<control_s>_>::push_back
                (position_meas,(value_type *)local_3f8);
      std::__cxx11::istringstream::~istringstream((istringstream *)&velocity);
    }
    filename_local._7_1_ = true;
    std::__cxx11::string::~string(local_258);
  }
  else {
    filename_local._7_1_ = false;
  }
  std::ifstream::~ifstream(&local_228);
  return filename_local._7_1_;
}

Assistant:

inline bool read_control_data(const std::string& filename, std::vector<control_s>& position_meas) {

	// Get file of position measurements:
	std::ifstream in_file_pos(filename.c_str(),std::ifstream::in);
	// Return if we can't open the file.
	if (!in_file_pos) {
		return false;
	}

	// Declare single line of position measurement file:
	std::string line_pos;

	// Run over each single line:
	while(getline(in_file_pos, line_pos)){

		std::istringstream iss_pos(line_pos);

		// Declare position values:
		double velocity, yawrate;

		// Declare single control measurement:
		control_s meas;

		//read data from line to values:

		iss_pos >> velocity;
		iss_pos >> yawrate;

		
		// Set values
		meas.velocity = velocity;
		meas.yawrate = yawrate;

		// Add to list of control measurements:
		position_meas.push_back(meas);
	}
	return true;
}